

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64 __thiscall google::protobuf::internal::ArenaImpl::SpaceUsed(ArenaImpl *this)

{
  __pointer_type this_00;
  uint64 uVar1;
  long in_RDI;
  uint64 space_used;
  SerialArena *serial;
  atomic<google::protobuf::internal::SerialArena_*> *in_stack_ffffffffffffffe8;
  uint64 uVar2;
  
  this_00 = std::atomic<google::protobuf::internal::SerialArena_*>::load
                      (in_stack_ffffffffffffffe8,(memory_order)((ulong)in_RDI >> 0x20));
  uVar2 = 0;
  for (; this_00 != (SerialArena *)0x0; this_00 = SerialArena::next(this_00)) {
    uVar1 = SerialArena::SpaceUsed(this_00);
    uVar2 = uVar1 + uVar2;
  }
  if (*(long *)(in_RDI + 0x20) != 0) {
    uVar2 = uVar2 - 0x28;
  }
  return uVar2;
}

Assistant:

uint64 ArenaImpl::SpaceUsed() const {
  SerialArena* serial = threads_.load(std::memory_order_acquire);
  uint64 space_used = 0;
  for (; serial; serial = serial->next()) {
    space_used += serial->SpaceUsed();
  }
  // Remove the overhead of Options structure, if any.
  if (options_) {
    space_used -= kOptionsSize;
  }
  return space_used;
}